

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

void __thiscall crnlib::dds_comp::dds_comp(dds_comp *this)

{
  itexture_comp *in_RDI;
  task_pool *this_00;
  
  itexture_comp::itexture_comp(in_RDI);
  in_RDI->_vptr_itexture_comp = (_func_int **)&PTR__dds_comp_002818f0;
  this_00 = (task_pool *)(in_RDI + 1);
  mipmapped_texture::mipmapped_texture((mipmapped_texture *)this_00);
  mipmapped_texture::mipmapped_texture((mipmapped_texture *)this_00);
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x13));
  in_RDI[0x15]._vptr_itexture_comp = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0x16]._vptr_itexture_comp = 0;
  dxt_image::pack_params::pack_params((pack_params *)0x1d368e);
  task_pool::task_pool(this_00);
  qdxt1_params::qdxt1_params((qdxt1_params *)0x1d36b9);
  qdxt5_params::qdxt5_params((qdxt5_params *)0x1d36cc);
  in_RDI[0x202]._vptr_itexture_comp = (_func_int **)0x0;
  return;
}

Assistant:

dds_comp::dds_comp()
    : m_pParams(NULL),
      m_pixel_fmt(PIXEL_FMT_INVALID),
      m_pQDXT_state(NULL) {
}